

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isValidURI(bool haveBaseURI,XMLCh *uriStr,bool bAllowSpaces)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  XMLSize_t XVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined7 in_register_00000039;
  XMLCh *src;
  ulong uVar12;
  ulong uVar13;
  XMLSize_t local_40;
  ulong local_38;
  
  uVar11 = CONCAT71(in_register_00000039,haveBaseURI) & 0xffffffff;
  do {
    src = uriStr;
    uriStr = src + 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*src] < '\0');
  XVar8 = XMLString::stringLen(src);
  uVar13 = XVar8 + 1;
  do {
    if (uVar13 == 1) goto LAB_0026b762;
    lVar1 = uVar13 - 2;
    uVar13 = uVar13 - 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)src[lVar1]] < '\0');
  local_40 = 0;
  local_38 = uVar11;
  iVar4 = XMLString::indexOf(src,L':');
  iVar5 = XMLString::indexOf(src,L'/');
  iVar6 = XMLString::indexOf(src,L'?');
  iVar7 = XMLString::indexOf(src,L'#');
  if ((((iVar4 < 1) || (iVar5 < iVar4 && iVar5 != -1)) || (iVar6 < iVar4 && iVar6 != -1)) ||
     (iVar7 != -1 && iVar7 < iVar4)) {
    uVar11 = 0;
    bVar3 = false;
    if ((iVar4 != 0 & (iVar7 == 0 | (byte)local_38)) == 0) goto LAB_0026b762;
    uVar11 = 0;
LAB_0026b695:
    if ((uVar11 + 1 < uVar13) && (bVar2 = XMLString::startsWith(src + uVar11,L"//"), bVar2)) {
      uVar10 = uVar11 + 2;
      uVar12 = uVar10;
      uVar9 = uVar10;
      if (uVar10 < uVar13) {
        uVar9 = uVar13;
      }
      while ((uVar11 = uVar9, uVar12 < uVar13 &&
             ((0x3f < (ulong)(ushort)src[uVar12] ||
              (uVar11 = uVar12,
              (0x8000800800000000U >> ((ulong)(ushort)src[uVar12] & 0x3f) & 1) == 0))))) {
        uVar12 = uVar12 + 1;
      }
      if ((uVar10 <= uVar11 && uVar11 - uVar10 != 0) &&
         (bVar2 = processAuthority(src + uVar10,uVar11 - uVar10), !bVar2)) goto LAB_0026b760;
    }
    if ((uVar13 <= uVar11) ||
       (bVar3 = processPath(src + uVar11,uVar13 - uVar11,bVar3,bAllowSpaces), bVar3)) {
      uVar11 = 1;
      goto LAB_0026b762;
    }
  }
  else {
    bVar3 = processScheme(src,&local_40);
    if (((bVar3) && (uVar13 - local_40 != 1)) && (src[local_40 + 1] != L'#')) {
      uVar11 = local_40 + 1;
      bVar3 = true;
      goto LAB_0026b695;
    }
  }
LAB_0026b760:
  uVar11 = 0;
LAB_0026b762:
  return SUB81(uVar11,0);
}

Assistant:

bool XMLUri::isValidURI(bool haveBaseURI, const XMLCh* const uriStr, bool bAllowSpaces/*=false*/)
{
    // get a trimmed version of uriStr
    // uriStr will NO LONGER be used in this function.
    const XMLCh* trimmedUriSpec = uriStr;

    while (XMLChar1_0::isWhitespace(*trimmedUriSpec))
        trimmedUriSpec++;

    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    while (trimmedUriSpecLen) {
        if (XMLChar1_0::isWhitespace(trimmedUriSpec[trimmedUriSpecLen-1]))
            trimmedUriSpecLen--;
        else
            break;
    }

    if (trimmedUriSpecLen == 0)
    {
        if (!haveBaseURI)
            return false;
        return true;
    }

    XMLSize_t index = 0;
    bool foundScheme = false;

    // Check for scheme, which must be before `/', '?' or '#'.
    int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
    int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
    int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
    int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

    if ((colonIdx <= 0) ||
        (colonIdx > slashIdx && slashIdx != -1) ||
        (colonIdx > queryIdx && queryIdx != -1) ||
        (colonIdx > fragmentIdx && fragmentIdx != -1))
    {
        // A standalone base is a valid URI according to spec
        if (colonIdx == 0 || (!haveBaseURI && fragmentIdx != 0))
            return false;
    }
    else
    {
        if (!processScheme(trimmedUriSpec, index))
            return false;
        foundScheme = true;
        ++index;
    }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
        return false;

	// two slashes means generic URI syntax, so we get the authority
    const XMLCh* authUriSpec = trimmedUriSpec +  index;
    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            if (!processAuthority(trimmedUriSpec + startPos, index - startPos))
                return false;
        }
    }

    // we need to check if index has exceed the length or not
    if (index < trimmedUriSpecLen)
    {
        if (!processPath(trimmedUriSpec + index, trimmedUriSpecLen - index, foundScheme, bAllowSpaces))
            return false;
    }

    return true;
}